

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  OneofDescriptor *pOVar1;
  uint32_t number;
  
  WriteUInt32ToUtf16CharSequence
            (((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_)->number_,output);
  number = GetExperimentalJavaFieldType
                     ((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  pOVar1 = (((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_)->scope_).
           containing_oneof;
  if (pOVar1 != (OneofDescriptor *)0x0) {
    WriteUInt32ToUtf16CharSequence
              ((int)((ulong)((long)pOVar1 - (long)pOVar1->containing_type_->oneof_decls_) >> 3) *
               -0x49249249,output);
    return;
  }
  protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb31);
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
}